

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
boost::exception_detail::clone_impl<boost::exception_detail::bad_exception_>::clone_impl
          (clone_impl<boost::exception_detail::bad_exception_> *this,bad_exception_ *x)

{
  error_info_container *peVar1;
  char *pcVar2;
  
  *(undefined ***)&this->field_0x30 = &PTR___cxa_pure_virtual_00125e78;
  (this->super_bad_exception_).super_exception._vptr_exception =
       (_func_int **)&PTR___cxa_pure_virtual_00125ef0;
  peVar1 = (x->super_exception).data_.px_;
  (this->super_bad_exception_).super_exception.data_.px_ = peVar1;
  if (peVar1 != (error_info_container *)0x0) {
    (**(code **)(*(long *)peVar1 + 0x18))();
  }
  (this->super_bad_exception_).super_exception.throw_line_ = (x->super_exception).throw_line_;
  pcVar2 = (x->super_exception).throw_file_;
  (this->super_bad_exception_).super_exception.throw_function_ =
       (x->super_exception).throw_function_;
  (this->super_bad_exception_).super_exception.throw_file_ = pcVar2;
  (this->super_bad_exception_).super_exception._vptr_exception = (_func_int **)0x1265f8;
  *(undefined8 *)&(this->super_bad_exception_).super_bad_exception = 0x126628;
  *(undefined8 *)&this->field_0x30 = 0x126668;
  copy_boost_exception((exception *)this,&x->super_exception);
  return;
}

Assistant:

explicit
            clone_impl( T const & x ):
                T(x)
                {
                copy_boost_exception(this,&x);
                }